

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O1

int ComputeDistanceCost(Command *cmds,size_t num_commands,BrotliDistanceParams *orig_params,
                       BrotliDistanceParams *new_params,double *cost,HistogramDistance *tmp)

{
  ulong uVar1;
  ushort uVar2;
  uint32_t uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint16_t *puVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  
  switchD_0105dc25::default(tmp,0,0x888);
  tmp->bit_cost_ = INFINITY;
  bVar11 = true;
  if (orig_params->distance_postfix_bits == new_params->distance_postfix_bits) {
    bVar11 = orig_params->num_direct_distance_codes != new_params->num_direct_distance_codes;
  }
  if (num_commands == 0) {
    dVar13 = 0.0;
  }
  else {
    puVar8 = &cmds->dist_prefix_;
    dVar13 = 0.0;
    do {
      bVar4 = true;
      if (((*(uint *)(puVar8 + -5) & 0x1ffffff) != 0) && (0x7f < puVar8[-1])) {
        uVar2 = *puVar8;
        uVar6 = (ulong)uVar2;
        if (bVar11) {
          uVar10 = uVar2 & 0x3ff;
          uVar3 = orig_params->num_direct_distance_codes;
          if (uVar3 + 0x10 <= uVar10) {
            bVar7 = (byte)orig_params->distance_postfix_bits;
            uVar10 = (uVar10 - uVar3) - 0x10;
            uVar10 = (*(uint32_t *)(puVar8 + -3) +
                      (((uVar10 >> (orig_params->distance_postfix_bits & 0x1f) & 1) != 0) + 2 <<
                      ((byte)(uVar2 >> 10) & 0x1f)) + -4 << (bVar7 & 0x1f)) +
                     (~(-1 << (bVar7 & 0x1f)) & uVar10) + uVar3 + 0x10;
          }
          uVar6 = (ulong)uVar10;
          if (new_params->max_distance < uVar6) {
            bVar4 = false;
            goto LAB_01c33fcd;
          }
          uVar1 = (ulong)new_params->num_direct_distance_codes + 0x10;
          if (uVar1 <= uVar6) {
            bVar7 = (byte)new_params->distance_postfix_bits;
            uVar6 = ((uVar6 - new_params->num_direct_distance_codes) + (4L << (bVar7 & 0x3f))) -
                    0x10;
            uVar10 = 0x1f;
            uVar5 = (uint)uVar6;
            if (uVar5 != 0) {
              for (; uVar5 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            uVar10 = (uVar10 ^ 0xffffffe0) + 0x1f;
            iVar9 = uVar10 - new_params->distance_postfix_bits;
            uVar6 = (ulong)(((uint)((uVar6 >> ((ulong)uVar10 & 0x3f) & 1) != 0) + iVar9 * 2 + 0xfffe
                            << (bVar7 & 0x3f)) + (int)uVar1 + (~(-1 << (bVar7 & 0x1f)) & uVar5) |
                           iVar9 * 0x400);
          }
        }
        tmp->data_[(uint)uVar6 & 0x3ff] = tmp->data_[(uint)uVar6 & 0x3ff] + 1;
        tmp->total_count_ = tmp->total_count_ + 1;
        dVar13 = dVar13 + (double)(int)((uVar6 & 0xffff) >> 10);
      }
LAB_01c33fcd:
      if (!bVar4) {
        return 0;
      }
      puVar8 = puVar8 + 8;
      num_commands = num_commands - 1;
    } while (num_commands != 0);
  }
  dVar12 = duckdb_brotli::BrotliPopulationCostDistance(tmp);
  *cost = dVar12 + dVar13;
  return 1;
}

Assistant:

static BROTLI_BOOL ComputeDistanceCost(const Command* cmds,
                                       size_t num_commands,
                                       const BrotliDistanceParams* orig_params,
                                       const BrotliDistanceParams* new_params,
                                       double* cost,
                                       HistogramDistance* tmp) {
  size_t i;
  BROTLI_BOOL equal_params = BROTLI_FALSE;
  uint16_t dist_prefix;
  uint32_t dist_extra;
  double extra_bits = 0.0;
  HistogramClearDistance(tmp);

  if (orig_params->distance_postfix_bits == new_params->distance_postfix_bits &&
      orig_params->num_direct_distance_codes ==
      new_params->num_direct_distance_codes) {
    equal_params = BROTLI_TRUE;
  }

  for (i = 0; i < num_commands; i++) {
    const Command* cmd = &cmds[i];
    if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
      if (equal_params) {
        dist_prefix = cmd->dist_prefix_;
      } else {
        uint32_t distance = CommandRestoreDistanceCode(cmd, orig_params);
        if (distance > new_params->max_distance) {
          return BROTLI_FALSE;
        }
        PrefixEncodeCopyDistance(distance,
                                 new_params->num_direct_distance_codes,
                                 new_params->distance_postfix_bits,
                                 &dist_prefix,
                                 &dist_extra);
      }
      HistogramAddDistance(tmp, dist_prefix & 0x3FF);
      extra_bits += dist_prefix >> 10;
    }
  }

  *cost = BrotliPopulationCostDistance(tmp) + extra_bits;
  return BROTLI_TRUE;
}